

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this,string *pfile,string *home)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  string line;
  string fname;
  string fpath;
  RuleHash hash;
  ifstream fin;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fin,(pfile->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    fname._M_dataplus._M_p = (pointer)&fname.field_2;
    fname._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    fname.field_2._M_local_buf[0] = '\0';
    while( true ) {
      bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1);
      if (!bVar1) break;
      if ((0x21 < line._M_string_length) && (*line._M_dataplus._M_p != '#')) {
        std::__cxx11::string::substr((ulong)&fpath,(ulong)&line);
        std::__cxx11::string::operator=((string *)&fname,(string *)&fpath);
        std::__cxx11::string::~string((string *)&fpath);
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
                ::find(&(this->RuleHashes)._M_t,&fname);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->RuleHashes)._M_t._M_impl.super__Rb_tree_header) {
          cmsys::SystemTools::CollapseFullPath(&fpath,&fname,(home->_M_dataplus)._M_p);
          bVar1 = cmsys::SystemTools::FileExists(fpath._M_dataplus._M_p);
          if (bVar1) {
            strncpy(hash.Data,line._M_dataplus._M_p,0x20);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
                     ::operator[](&this->RuleHashes,&fname);
            *(undefined8 *)(pmVar4->Data + 0x10) = hash.Data._16_8_;
            *(undefined8 *)(pmVar4->Data + 0x18) = hash.Data._24_8_;
            *(undefined8 *)pmVar4->Data = hash.Data._0_8_;
            *(undefined8 *)(pmVar4->Data + 8) = hash.Data._8_8_;
          }
          std::__cxx11::string::~string((string *)&fpath);
        }
        else {
          iVar2 = strncmp(line._M_dataplus._M_p,(char *)(iVar3._M_node + 2),0x20);
          if (iVar2 != 0) {
            cmsys::SystemTools::CollapseFullPath(&fpath,&fname,(home->_M_dataplus)._M_p);
            std::__cxx11::string::operator=((string *)&fname,(string *)&fpath);
            std::__cxx11::string::~string((string *)&fpath);
            cmsys::SystemTools::RemoveFile(&fname);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&fname);
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&fin);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes(std::string const& pfile,
                                        std::string const& home)
{
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(pfile.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(pfile.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    return;
    }
  std::string line;
  std::string fname;
  while(cmSystemTools::GetLineFromStream(fin, line))
    {
    // Line format is a 32-byte hex string followed by a space
    // followed by a file name (with no escaping).

    // Skip blank and comment lines.
    if(line.size() < 34 || line[0] == '#')
      {
      continue;
      }

    // Get the filename.
    fname = line.substr(33, line.npos);

    // Look for a hash for this file's rule.
    std::map<std::string, RuleHash>::const_iterator rhi =
      this->RuleHashes.find(fname);
    if(rhi != this->RuleHashes.end())
      {
      // Compare the rule hash in the file to that we were given.
      if(strncmp(line.c_str(), rhi->second.Data, 32) != 0)
        {
        // The rule has changed.  Delete the output so it will be
        // built again.
        fname = cmSystemTools::CollapseFullPath(fname, home.c_str());
        cmSystemTools::RemoveFile(fname);
        }
      }
    else
      {
      // We have no hash for a rule previously listed.  This may be a
      // case where a user has turned off a build option and might
      // want to turn it back on later, so do not delete the file.
      // Instead, we keep the rule hash as long as the file exists so
      // that if the feature is turned back on and the rule has
      // changed the file is still rebuilt.
      std::string fpath =
        cmSystemTools::CollapseFullPath(fname, home.c_str());
      if(cmSystemTools::FileExists(fpath.c_str()))
        {
        RuleHash hash;
        strncpy(hash.Data, line.c_str(), 32);
        this->RuleHashes[fname] = hash;
        }
      }
    }
}